

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

bool wallet::GetWalletNameFromJSONRPCRequest(JSONRPCRequest *request,string *wallet_name)

{
  pointer __s1;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  string_view url_encoded;
  string local_50;
  long local_30;
  
  uVar2 = _DAT_00b279c8;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __s1 = (request->URI)._M_dataplus._M_p;
  uVar1 = (request->URI)._M_string_length;
  if (uVar1 < _DAT_00b279c8) {
    bVar4 = false;
  }
  else if (_DAT_00b279c8 == 0) {
    bVar4 = true;
  }
  else {
    iVar3 = bcmp(__s1,WALLET_ENDPOINT_BASE_abi_cxx11_,_DAT_00b279c8);
    bVar4 = iVar3 == 0;
  }
  if (bVar4 != false) {
    url_encoded._M_len = uVar1 - uVar2;
    if (uVar1 < uVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar2,uVar1);
      }
      goto LAB_0063b7f5;
    }
    url_encoded._M_str = __s1 + uVar2;
    UrlDecode_abi_cxx11_(&local_50,url_encoded);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (wallet_name,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
LAB_0063b7f5:
  __stack_chk_fail();
}

Assistant:

bool GetWalletNameFromJSONRPCRequest(const JSONRPCRequest& request, std::string& wallet_name)
{
    if (request.URI.starts_with(WALLET_ENDPOINT_BASE)) {
        // wallet endpoint was used
        wallet_name = UrlDecode(std::string_view{request.URI}.substr(WALLET_ENDPOINT_BASE.size()));
        return true;
    }
    return false;
}